

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O1

uint32_t __thiscall
asmjit::v1_14::RALocalAllocator::decideOnAssignment
          (RALocalAllocator *this,RegGroup group,uint32_t workId,uint32_t physId,
          RegMask allocableRegs)

{
  uint **ppuVar1;
  uint **ppuVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  WorkToPhysMap *pWVar7;
  BaseCompiler *pBVar8;
  PhysToWorkMap *pPVar9;
  PhysToWorkMap *pPVar10;
  uint *puVar11;
  uint *puVar12;
  uint uVar13;
  RegGroup RVar14;
  uint32_t homeId;
  uint uVar15;
  uint32_t uVar16;
  Error EVar17;
  RABlock *pRVar19;
  uint uVar20;
  ulong uVar21;
  uint extraout_EDX;
  uint uVar22;
  RABlock *block;
  uint uVar23;
  ulong unaff_RBX;
  long lVar24;
  undefined7 in_register_00000031;
  BaseNode *pBVar25;
  InstNode *node;
  RALocalAllocator *this_00;
  undefined4 in_register_00000084;
  long in_R9;
  uint *puVar26;
  ulong unaff_R12;
  ulong unaff_R13;
  uint uVar27;
  InstNode *pIVar28;
  bool bVar29;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  ulong uStack_c0;
  ulong uStack_b8;
  ulong uStack_b0;
  RALocalAllocator *pRStack_a8;
  InstNode *pIStack_a0;
  long lStack_98;
  Error EStack_8c;
  ulong uStack_88;
  RALocalAllocator *pRStack_80;
  InstNode *pIStack_78;
  BaseNode *pBStack_70;
  ulong uStack_68;
  ulong uStack_60;
  ulong uVar18;
  
  puVar26 = (uint *)CONCAT44(in_register_00000084,allocableRegs);
  pBVar25 = (BaseNode *)CONCAT71(in_register_00000031,group);
  uVar18 = (ulong)physId;
  if (allocableRegs == 0) {
    decideOnAssignment();
LAB_00124e1c:
    decideOnAssignment();
  }
  else {
    if (*(uint *)&this->_pass->field_0x148 <= workId) goto LAB_00124e1c;
    uVar18 = *(ulong *)(*(long *)&this->_pass->_workRegs + (ulong)workId * 8);
    bVar3 = *(byte *)(uVar18 + 0x4a);
    if ((bVar3 != 0xff) && ((allocableRegs >> (bVar3 & 0x1f) & 1) != 0)) {
      return (uint)bVar3;
    }
    if (group < kPC) {
      uVar15 = *(uint *)(uVar18 + 0x3c) & allocableRegs;
      if (uVar15 == 0) {
        uVar15 = allocableRegs;
      }
      uVar20 = ~(this->_funcPreservedRegs)._masks._data[group] & uVar15;
      if (uVar20 == 0) {
        uVar20 = uVar15;
      }
      uVar16 = 0;
      if (uVar20 == 0) {
        return 0;
      }
      for (; (uVar20 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
      }
      return uVar16;
    }
  }
  uVar15 = (uint)uVar18;
  decideOnAssignment();
  uVar20 = (uint)puVar26;
  if (uVar20 == 0) {
    decideOnReassignment();
LAB_00124ef1:
    decideOnReassignment();
  }
  else {
    if (*(uint *)&this->_pass->field_0x148 <= extraout_EDX) goto LAB_00124ef1;
    lVar24 = *(long *)(*(long *)&this->_pass->_workRegs + (ulong)extraout_EDX * 8);
    bVar3 = *(byte *)(lVar24 + 0x4a);
    if ((bVar3 != 0xff) && ((uVar20 >> (bVar3 & 0x1f) & 1) != 0)) {
      return (uint)bVar3;
    }
    uVar15 = extraout_EDX;
    if ((byte)pBVar25 < 4) {
      uVar18 = (ulong)pBVar25 & 0xff;
      uVar16 = (uint32_t)uVar18;
      uVar21 = (ulong)*(byte *)(in_R9 + 0x18 + uVar18);
      if (uVar21 != 0) {
        puVar26 = (uint *)(in_R9 + (ulong)((*(uint *)(in_R9 + 0x14) >> ((byte)pBVar25 * '\b' & 0x1f)
                                           & 0xff) << 5) + 0x4c);
        do {
          if (*puVar26 == extraout_EDX) goto LAB_00124eab;
          puVar26 = puVar26 + 8;
          uVar21 = uVar21 - 1;
        } while (uVar21 != 0);
      }
      puVar26 = (uint *)0x0;
LAB_00124eab:
      if ((puVar26 != (uint *)0x0) && ((puVar26[2] & 0x40008) != 0)) {
        uVar16 = 0;
        if (uVar20 == 0) {
          return 0;
        }
        for (; (uVar20 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
        }
        return uVar16;
      }
      if ((*(byte *)(lVar24 + 0x24) & 4) == 0) {
        uVar20 = ~*(uint *)(lVar24 + 0x38) & uVar20;
        if (uVar20 != 0) {
          uVar15 = ~(this->_funcPreservedRegs)._masks._data[uVar18] & uVar20;
          if (uVar15 == 0) {
            uVar15 = uVar20;
          }
          uVar16 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
            }
          }
        }
        if (uVar20 != 0) {
          return uVar16;
        }
      }
      return 0xff;
    }
  }
  decideOnReassignment();
  if (uVar15 == 0) {
LAB_00124fda:
    decideOnSpillFor();
  }
  else if ((byte)pBVar25 < 4) {
    uVar20 = 0;
    if (uVar15 != 0) {
      for (; (uVar15 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
      }
    }
    uVar21 = (ulong)pBVar25 & 0xff;
    pBVar25 = (BaseNode *)(this->_curAssignment)._physToWorkIds._data[uVar21];
    uVar22 = *(uint *)(pBVar25 + (ulong)uVar20 * 4);
    uVar18 = (ulong)uVar22;
    uVar15 = uVar15 - 1 & uVar15;
    if (uVar15 == 0) {
LAB_00124fc9:
      *puVar26 = uVar22;
      return uVar20;
    }
    uVar4 = *(uint *)&this->_pass->field_0x148;
    if (uVar22 < uVar4) {
      lVar24 = *(long *)&this->_pass->_workRegs;
      uVar23 = (uint)(*(float *)(*(long *)(lVar24 + uVar18 * 8) + 100) * 1048576.0);
      uVar5 = (((this->_curAssignment)._physToWorkMap)->dirty)._masks._data[uVar21];
      this = (RALocalAllocator *)(ulong)uVar5;
      uVar22 = uVar23 + 0x40000;
      if ((uVar5 >> (uVar20 & 0x1f) & 1) == 0) {
        uVar22 = uVar23;
      }
      uVar21 = (ulong)uVar22;
      do {
        uVar23 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
          }
        }
        unaff_RBX = (ulong)uVar23;
        uVar22 = *(uint *)(pBVar25 + unaff_RBX * 4);
        if (uVar4 <= uVar22) {
          decideOnSpillFor();
          goto LAB_00124fda;
        }
        uVar27 = (uint)(*(float *)(*(long *)(lVar24 + (ulong)uVar22 * 8) + 100) * 1048576.0);
        uVar13 = uVar27 + 0x40000;
        if ((uVar5 >> (uVar23 & 0x1f) & 1) == 0) {
          uVar13 = uVar27;
        }
        unaff_R12 = (ulong)uVar13;
        bVar29 = uVar13 < (uint)uVar21;
        if (bVar29) {
          uVar18 = (ulong)uVar22;
          uVar21 = unaff_R12;
        }
        uVar22 = (uint)uVar18;
        if (bVar29) {
          uVar20 = uVar23;
        }
        uVar15 = uVar15 - 1 & uVar15;
      } while (uVar15 != 0);
      goto LAB_00124fc9;
    }
    goto LAB_00124fe4;
  }
  decideOnSpillFor();
LAB_00124fe4:
  decideOnSpillFor();
  uVar18 = *(ulong *)(pBVar25 + 0x20);
  node = (InstNode *)(ulong)*(uint *)(uVar18 + 0x10);
  if (node != (InstNode *)0x0) {
    pRStack_80 = (RALocalAllocator *)&this->_curAssignment;
    lVar24 = uVar18 + 0x54;
    pIVar28 = (InstNode *)0x0;
    this_00 = this;
    pIStack_78 = node;
    pBStack_70 = pBVar25;
    uStack_68 = unaff_RBX;
    uStack_60 = unaff_R12;
    do {
      if ((InstNode *)(ulong)*(uint *)(uVar18 + 0x10) <= pIVar28) {
        lStack_98 = 0x125140;
        spillAfterAllocation();
LAB_00125140:
        lStack_98 = 0x125145;
        spillAfterAllocation();
LAB_00125145:
        lStack_98 = 0x12514a;
        spillAfterAllocation();
LAB_0012514a:
        lStack_98 = 0x12514f;
        spillAfterAllocation();
LAB_0012514f:
        lStack_98 = 0x125154;
        spillAfterAllocation();
LAB_00125154:
        lStack_98 = 0x125159;
        spillAfterAllocation();
        (this_00->_cc->super_BaseBuilder)._cursor = *(BaseNode **)node;
        uStack_c0 = uVar18;
        uStack_b8 = unaff_R12;
        uStack_b0 = unaff_R13;
        pRStack_a8 = this;
        pIStack_a0 = pIVar28;
        lStack_98 = lVar24;
        if (*(PhysToWorkMap **)(block + 200) != (PhysToWorkMap *)0x0) {
          EVar17 = switchToAssignment(this_00,*(PhysToWorkMap **)(block + 200),
                                      (ZoneBitVector *)(block + 0x78),
                                      SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),true);
          uVar18 = (ulong)EVar17;
          if (EVar17 != 0) {
            return EVar17;
          }
        }
        EVar17 = allocInst(this_00,node);
        if (EVar17 != 0) {
          return EVar17;
        }
        uVar15 = *(uint *)(block + 0xb8);
        if ((ulong)uVar15 == 0xffffffff) {
          pRVar19 = block + 0xbc;
LAB_001251fe:
          EVar17 = spillScratchGpRegsBeforeEntry(this_00,*(RegMask *)pRVar19);
          if (EVar17 != 0) {
            return EVar17;
          }
          if (*(long *)(block + 200) == 0) {
            EVar17 = BaseRAPass::setBlockEntryAssignment
                               (this_00->_pass,block,this_00->_block,&this_00->_curAssignment);
            if (EVar17 != 0) {
              return EVar17;
            }
            goto LAB_001253c0;
          }
          pBVar25 = *(BaseNode **)this_00->_pass->_extraBlock;
          pRVar19 = (RABlock *)BaseBuilder::setCursor(&this_00->_cc->super_BaseBuilder,pBVar25);
          pWVar7 = (this_00->_curAssignment)._workToPhysMap;
          memcpy((this_00->_tmpAssignment)._physToWorkMap,(this_00->_curAssignment)._physToWorkMap,
                 (ulong)(this_00->_tmpAssignment)._layout.physTotal * 4 + 0x20);
          memcpy((this_00->_tmpAssignment)._workToPhysMap,pWVar7,
                 (ulong)(this_00->_tmpAssignment)._layout.workCount);
          bVar29 = false;
          EVar17 = switchToAssignment(this_00,*(PhysToWorkMap **)(block + 200),
                                      (ZoneBitVector *)(block + 0x78),
                                      SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),false);
          if (EVar17 != 0) goto LAB_001253bb;
          EVar17 = (Error)uVar18;
          if ((this_00->_cc->super_BaseBuilder)._cursor != pBVar25) {
            if ((uint)(byte)node[0x13] <= (byte)node[0x12] - 1) goto LAB_001253d8;
            lVar24 = (ulong)((byte)node[0x12] - 1) * 0x10;
            if ((*(uint *)(node + lVar24 + 0x40) & 7) != 5) goto LAB_001253dd;
            (*(this_00->_cc->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[4])(&uStack_e8);
            uStack_d8 = *(undefined8 *)(node + lVar24 + 0x40);
            uStack_d0 = *(undefined8 *)(node + lVar24 + 0x48);
            *(undefined4 *)(node + lVar24 + 0x40) = uStack_e8;
            *(undefined4 *)(node + lVar24 + 0x44) = uStack_e4;
            *(undefined4 *)(node + lVar24 + 0x48) = uStack_e0;
            *(undefined4 *)(node + lVar24 + 0x4c) = uStack_dc;
            node[0x34] = (InstNode)((byte)node[0x34] & 0xef);
            EVar17 = (*(this_00->_pass->super_FuncPass).super_Pass._vptr_Pass[0xd])();
            bVar29 = EVar17 == 0;
            if (bVar29) {
              pBVar8 = this_00->_cc;
              (pBVar8->super_BaseBuilder)._cursor = pBVar25;
              (*(pBVar8->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[6])
                        (pBVar8,&uStack_e8);
              EVar17 = (Error)uVar18;
            }
            goto LAB_00125340;
          }
        }
        else {
          if (uVar15 < *(uint *)(*(long *)block + 0xf0)) {
            pRVar19 = (RABlock *)((ulong)uVar15 * 0x20 + *(long *)(*(long *)block + 0xe8));
            goto LAB_001251fe;
          }
          allocBranch();
          pRVar19 = block;
LAB_001253d8:
          allocBranch();
LAB_001253dd:
          EVar17 = 3;
          bVar29 = false;
LAB_00125340:
          if (!bVar29) {
            bVar29 = false;
            goto LAB_001253bb;
          }
        }
        (this_00->_cc->super_BaseBuilder)._cursor = (BaseNode *)pRVar19;
        pWVar7 = (this_00->_curAssignment)._workToPhysMap;
        pPVar9 = (this_00->_curAssignment)._physToWorkMap;
        pPVar10 = (this_00->_tmpAssignment)._physToWorkMap;
        (this_00->_curAssignment)._workToPhysMap = (this_00->_tmpAssignment)._workToPhysMap;
        (this_00->_curAssignment)._physToWorkMap = pPVar10;
        (this_00->_tmpAssignment)._workToPhysMap = pWVar7;
        (this_00->_tmpAssignment)._physToWorkMap = pPVar9;
        lVar24 = 0;
        do {
          ppuVar1 = (this_00->_curAssignment)._physToWorkIds._data + lVar24;
          puVar26 = *ppuVar1;
          puVar11 = ppuVar1[1];
          ppuVar2 = (this_00->_tmpAssignment)._physToWorkIds._data + lVar24;
          puVar12 = ppuVar2[1];
          ppuVar1 = (this_00->_curAssignment)._physToWorkIds._data + lVar24;
          *ppuVar1 = *ppuVar2;
          ppuVar1[1] = puVar12;
          ppuVar1 = (this_00->_tmpAssignment)._physToWorkIds._data + lVar24;
          *ppuVar1 = puVar26;
          ppuVar1[1] = puVar11;
          lVar24 = lVar24 + 2;
        } while (lVar24 != 4);
        bVar29 = true;
LAB_001253bb:
        if (bVar29) {
LAB_001253c0:
          EVar17 = 0;
        }
        return EVar17;
      }
      bVar29 = true;
      if ((*(byte *)(lVar24 + 2) & 2) != 0) {
        uVar15 = *(uint *)(lVar24 + -8);
        unaff_R12 = (ulong)uVar15;
        if (*(uint *)&this->_pass->field_0x148 <= uVar15) goto LAB_00125140;
        lVar6 = *(long *)(*(long *)&this->_pass->_workRegs + unaff_R12 * 8);
        if (*(char *)(lVar6 + 0x4a) != -1) goto LAB_00125110;
        if (uVar15 == 0xffffffff) goto LAB_00125145;
        if ((this->_curAssignment)._layout.workCount <= uVar15) goto LAB_0012514a;
        bVar3 = (this->_curAssignment)._workToPhysMap[unaff_R12].physIds[0];
        unaff_R13 = (ulong)bVar3;
        if (bVar3 == 0xff) goto LAB_00125110;
        RVar14 = *(RegGroup *)(lVar6 + 0x21);
        (this->_cc->super_BaseBuilder)._cursor = pBStack_70;
        if (0x1f < bVar3) goto LAB_0012514f;
        RVar14 = RVar14 & kMaxValue;
        if (kExtraVirt3 < RVar14) goto LAB_00125154;
        if (((((this->_curAssignment)._physToWorkMap)->dirty)._masks._data[RVar14] >> (bVar3 & 0x1f)
            & 1) == 0) {
LAB_001250e9:
          lStack_98 = 0x1250f9;
          this_00 = pRStack_80;
          RAAssignment::unassign((RAAssignment *)pRStack_80,RVar14,uVar15,(uint)bVar3);
          EVar17 = 0;
        }
        else {
          lStack_98 = 0x1250e0;
          this_00 = this;
          uStack_88 = (ulong)RVar14;
          EVar17 = onSaveReg(this,RVar14,uVar15,(uint)bVar3);
          RVar14 = (RegGroup)uStack_88;
          if (EVar17 == 0) goto LAB_001250e9;
        }
        bVar29 = EVar17 == 0;
        node = pIStack_78;
        if (!bVar29) {
          EStack_8c = EVar17;
        }
      }
LAB_00125110:
      if (!bVar29) {
        return EStack_8c;
      }
      pIVar28 = pIVar28 + 1;
      lVar24 = lVar24 + 0x20;
    } while (node != pIVar28);
  }
  return 0;
}

Assistant:

uint32_t RALocalAllocator::decideOnAssignment(RegGroup group, uint32_t workId, uint32_t physId, RegMask allocableRegs) const noexcept {
  ASMJIT_ASSERT(allocableRegs != 0);
  DebugUtils::unused(group, physId);

  RAWorkReg* workReg = workRegById(workId);

  // Prefer home register id, if possible.
  if (workReg->hasHomeRegId()) {
    uint32_t homeId = workReg->homeRegId();
    if (Support::bitTest(allocableRegs, homeId)) {
      return homeId;
    }
  }

  // Prefer registers used upon block entries.
  RegMask previouslyAssignedRegs = workReg->allocatedMask();
  if (allocableRegs & previouslyAssignedRegs) {
    allocableRegs &= previouslyAssignedRegs;
  }

  return pickBestSuitableRegister(group, allocableRegs);
}